

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.cpp
# Opt level: O0

int asn1_get_tagged_int(uchar **p,uchar *end,int tag,int *val)

{
  uint *in_RCX;
  long *in_RDI;
  bool bVar1;
  size_t len;
  int ret;
  size_t *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  uchar **in_stack_ffffffffffffffc8;
  undefined4 local_4;
  
  local_4 = mbedtls_asn1_get_tag
                      (in_stack_ffffffffffffffc8,
                       (uchar *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffb8,0);
  if (local_4 == 0) {
    if (in_stack_ffffffffffffffc8 == (uchar **)0x0) {
      local_4 = -100;
    }
    else if ((*(byte *)*in_RDI & 0x80) == 0) {
      while( true ) {
        bVar1 = false;
        if (in_stack_ffffffffffffffc8 != (uchar **)0x0) {
          bVar1 = *(char *)*in_RDI == '\0';
        }
        if (!bVar1) break;
        *in_RDI = *in_RDI + 1;
        in_stack_ffffffffffffffc8 = (uchar **)((long)in_stack_ffffffffffffffc8 + -1);
      }
      if (in_stack_ffffffffffffffc8 < (uchar **)0x5) {
        if ((in_stack_ffffffffffffffc8 == (uchar **)0x4) && ((*(byte *)*in_RDI & 0x80) != 0)) {
          local_4 = -100;
        }
        else {
          *in_RCX = 0;
          while (in_stack_ffffffffffffffc8 != (uchar **)0x0) {
            *in_RCX = *in_RCX << 8 | (uint)*(byte *)*in_RDI;
            *in_RDI = *in_RDI + 1;
            in_stack_ffffffffffffffc8 = (uchar **)((long)in_stack_ffffffffffffffc8 + -1);
          }
          local_4 = 0;
        }
      }
      else {
        local_4 = -100;
      }
    }
    else {
      local_4 = -100;
    }
  }
  return local_4;
}

Assistant:

static int asn1_get_tagged_int(unsigned char **p,
                               const unsigned char *end,
                               int tag, int *val)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len;

    if ((ret = mbedtls_asn1_get_tag(p, end, &len, tag)) != 0) {
        return ret;
    }

    /*
     * len==0 is malformed (0 must be represented as 020100 for INTEGER,
     * or 0A0100 for ENUMERATED tags
     */
    if (len == 0) {
        return MBEDTLS_ERR_ASN1_INVALID_LENGTH;
    }
    /* This is a cryptography library. Reject negative integers. */
    if ((**p & 0x80) != 0) {
        return MBEDTLS_ERR_ASN1_INVALID_LENGTH;
    }

    /* Skip leading zeros. */
    while (len > 0 && **p == 0) {
        ++(*p);
        --len;
    }

    /* Reject integers that don't fit in an int. This code assumes that
     * the int type has no padding bit. */
    if (len > sizeof(int)) {
        return MBEDTLS_ERR_ASN1_INVALID_LENGTH;
    }
    if (len == sizeof(int) && (**p & 0x80) != 0) {
        return MBEDTLS_ERR_ASN1_INVALID_LENGTH;
    }

    *val = 0;
    while (len-- > 0) {
        *val = (*val << 8) | **p;
        (*p)++;
    }

    return 0;
}